

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O3

bool CheckConfigFileVariable
               (TCascStorage *hs,char *szLinePtr,char *szLineEnd,char *szVarName,
               PARSE_VARIABLE PfnParseProc,void *pvParseParam)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  byte *pbVar6;
  bool bVar7;
  char szVariableName [80];
  byte local_78 [80];
  
  pbVar6 = (byte *)szLinePtr;
  if (szLinePtr < szLineEnd) {
    do {
      szLinePtr = (char *)pbVar6;
      if (0x20 < (byte)*szLinePtr) break;
      pbVar6 = (byte *)szLinePtr + 1;
      szLinePtr = szLineEnd;
    } while (pbVar6 != (byte *)szLineEnd);
  }
  if (szLinePtr < szLineEnd) {
    uVar4 = 0;
    while ((bVar2 = *szLinePtr, uVar1 = uVar4, 0x20 < bVar2 && (bVar2 != 0x3d))) {
      szLinePtr = (char *)((byte *)szLinePtr + 1);
      uVar1 = uVar4 + 1;
      local_78[uVar4] = bVar2;
      if ((szLineEnd <= szLinePtr) || (bVar7 = 0x4d < uVar4, uVar4 = uVar1, bVar7)) break;
    }
    local_78[uVar1] = 0;
  }
  else {
    local_78[0] = 0;
    if ((byte *)szLinePtr == (byte *)0x0) {
      return false;
    }
  }
  bVar7 = CheckWildCard((char *)local_78,szVarName);
  if (!bVar7) {
    return false;
  }
  if (szLinePtr < szLineEnd) {
    lVar5 = (long)szLineEnd - (long)szLinePtr;
    do {
      if (0x20 < (byte)*szLinePtr && *szLinePtr != 0x3d) {
        iVar3 = (*PfnParseProc)(hs,(char *)local_78,szLinePtr,szLineEnd,pvParseParam);
        return iVar3 == 0;
      }
      szLinePtr = (char *)((byte *)szLinePtr + 1);
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    return false;
  }
  return false;
}

Assistant:

static bool CheckConfigFileVariable(
    TCascStorage * hs,                  // Pointer to storage structure
    const char * szLinePtr,             // Pointer to the begin of the line
    const char * szLineEnd,             // Pointer to the end of the line
    const char * szVarName,             // Pointer to the variable to check
    PARSE_VARIABLE PfnParseProc,        // Pointer to the parsing function
    void * pvParseParam)                // Pointer to the parameter passed to parsing function
{
    char szVariableName[MAX_VAR_NAME];

    // Capture the variable from the line
    szLinePtr = CaptureSingleString(szLinePtr, szLineEnd, szVariableName, sizeof(szVariableName));
    if (szLinePtr == NULL)
        return false;

    // Verify whether this is the variable
    if (!CheckWildCard(szVariableName, szVarName))
        return false;

    // Skip the spaces and '='
    while (szLinePtr < szLineEnd && (IsWhiteSpace(szLinePtr) || szLinePtr[0] == '='))
        szLinePtr++;

    // Call the parsing function only if there is some data
    if (szLinePtr >= szLineEnd)
        return false;

    return (PfnParseProc(hs, szVariableName, szLinePtr, szLineEnd, pvParseParam) == ERROR_SUCCESS);
}